

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineShape.cpp
# Opt level: O3

void __thiscall chrono::ChLineShape::ChLineShape(ChLineShape *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 auVar3 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ChLine *__tmp;
  
  ChVisualShape::ChVisualShape(&this->super_ChVisualShape);
  (this->super_ChVisualShape)._vptr_ChVisualShape = (_func_int **)&PTR__ChLineShape_00b41e18;
  (this->gline).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->gline).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->npoints = 200;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x50);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  auVar3._8_8_ = DAT_00b689a0;
  auVar3._0_8_ = VNULL;
  _Var4._M_use_count = (undefined4)DAT_00b689a8;
  _Var4._M_weak_count = DAT_00b689a8._4_4_;
  _Var4._vptr__Sp_counted_base = DAT_00b689a0;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b1b310;
  *(undefined1 *)&p_Var5[1]._M_use_count = 0;
  p_Var5[1]._M_weak_count = 2;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChGeometry_00b3d8b8;
  _Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
          vunpcklpd_avx(auVar3,(undefined1  [16])_Var4);
  _Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
          vshufpd_avx((undefined1  [16])_Var4,auVar3,1);
  p_Var5[3] = _Var1;
  p_Var5[2] = _Var2;
  p_Var5[4] = _Var4;
  (this->gline).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var5 + 1);
  this_00 = (this->gline).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->gline).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

ChLineShape::ChLineShape() : npoints(200) {
    gline = chrono_types::make_shared<geometry::ChLineSegment>();
}